

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

bool __thiscall
CPubKey::Derive(CPubKey *this,CPubKey *pubkeyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t inputlen;
  long in_FS_OFFSET;
  size_t publen;
  uchar pub [33];
  secp256k1_pubkey pubkey;
  uchar out [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = this->vch[0];
  if ((bVar2 & 0xfe) != 2) {
    if ((7 < bVar2) || ((0xd0U >> (bVar2 & 0x1f) & 1) == 0)) {
      __assert_fail("IsValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pubkey.cpp"
                    ,0x14d,
                    "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                   );
    }
    if (-1 < (int)nChild) {
      __assert_fail("size() == COMPRESSED_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pubkey.cpp"
                    ,0x14f,
                    "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                   );
    }
LAB_00647369:
    __assert_fail("(nChild >> 31) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pubkey.cpp"
                  ,0x14e,
                  "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                 );
  }
  if ((int)nChild < 0) goto LAB_00647369;
  BIP32Hash(cc,nChild,bVar2,this->vch + 1,out);
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x10) = out._48_8_;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 0x18) = out._56_8_;
  *(undefined8 *)(ccChild->super_base_blob<256U>).m_data._M_elems = out._32_8_;
  *(undefined8 *)((ccChild->super_base_blob<256U>).m_data._M_elems + 8) = out._40_8_;
  if ((this->vch[0] & 0xfe) == 2) {
    inputlen = 0x21;
  }
  else {
    bVar2 = this->vch[0] - 4;
    if (bVar2 < 4) {
      inputlen = *(size_t *)(&DAT_006d3710 + (ulong)bVar2 * 8);
    }
    else {
      inputlen = 0;
    }
  }
  iVar4 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&pubkey,this->vch,inputlen);
  if (iVar4 != 0) {
    iVar4 = secp256k1_ec_pubkey_tweak_add(secp256k1_context_static,&pubkey,out);
    if (iVar4 != 0) {
      publen = 0x21;
      secp256k1_ec_pubkey_serialize(secp256k1_context_static,pub,&publen,&pubkey,0x102);
      Set<unsigned_char*>(pubkeyChild,pub,pub + publen);
      bVar3 = true;
      goto LAB_00647315;
    }
  }
  bVar3 = false;
LAB_00647315:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Derive(CPubKey& pubkeyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert((nChild >> 31) == 0);
    assert(size() == COMPRESSED_SIZE);
    unsigned char out[64];
    BIP32Hash(cc, nChild, *begin(), begin()+1, out);
    memcpy(ccChild.begin(), out+32, 32);
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!secp256k1_ec_pubkey_tweak_add(secp256k1_context_static, &pubkey, out)) {
        return false;
    }
    unsigned char pub[COMPRESSED_SIZE];
    size_t publen = COMPRESSED_SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_COMPRESSED);
    pubkeyChild.Set(pub, pub + publen);
    return true;
}